

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kaitaistream.cpp
# Opt level: O2

string * kaitai::kstream::bytes_to_str(string *__return_storage_ptr__,string *src,string *src_enc)

{
  size_t sVar1;
  int iVar2;
  iconv_t __cd;
  size_t sVar3;
  int *piVar4;
  runtime_error *prVar5;
  size_t sVar6;
  size_t dst_left;
  pointer local_48;
  char *src_ptr;
  size_t src_left;
  
  __cd = iconv_open("UTF-8",(src_enc->_M_dataplus)._M_p);
  if (__cd == (iconv_t)0xffffffffffffffff) {
    piVar4 = __errno_location();
    iVar2 = *piVar4;
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    if (iVar2 == 0x16) {
      std::runtime_error::runtime_error(prVar5,"invalid encoding pair conversion requested");
    }
    else {
      std::runtime_error::runtime_error(prVar5,"error opening iconv");
    }
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  src_left = src->_M_string_length;
  sVar6 = src_left * 2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)sVar6);
  src_ptr = (src->_M_dataplus)._M_p;
  local_48 = (__return_storage_ptr__->_M_dataplus)._M_p;
  dst_left = sVar6;
  while( true ) {
    sVar3 = iconv(__cd,&src_ptr,&src_left,&local_48,&dst_left);
    if (sVar3 != 0xffffffffffffffff) {
      std::__cxx11::string::resize((ulong)__return_storage_ptr__);
      iVar2 = iconv_close(__cd);
      if (iVar2 == 0) {
        return __return_storage_ptr__;
      }
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"iconv close error");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    piVar4 = __errno_location();
    sVar1 = dst_left;
    if (*piVar4 != 7) break;
    dst_left = dst_left + sVar6;
    std::__cxx11::string::resize((ulong)__return_storage_ptr__);
    local_48 = (__return_storage_ptr__->_M_dataplus)._M_p + (sVar6 - sVar1);
    sVar6 = sVar6 * 2;
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar5,"iconv error");
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string kaitai::kstream::bytes_to_str(std::string src, std::string src_enc) {
    iconv_t cd = iconv_open(KS_STR_DEFAULT_ENCODING, src_enc.c_str());

    if (cd == (iconv_t) -1) {
        if (errno == EINVAL) {
            throw std::runtime_error("invalid encoding pair conversion requested");
        } else {
            throw std::runtime_error("error opening iconv");
        }
    }

    size_t src_len = src.length();
    size_t src_left = src_len;

    // Start with a buffer length of double the source length.
    size_t dst_len = src_len * 2;
    std::string dst(dst_len, ' ');
    size_t dst_left = dst_len;

    char *src_ptr = &src[0];
    char *dst_ptr = &dst[0];

    while (true) {
        size_t res = iconv(cd, &src_ptr, &src_left, &dst_ptr, &dst_left);

        if (res == (size_t) -1) {
            if (errno == E2BIG) {
                // dst buffer is not enough to accomodate whole string
                // enlarge the buffer and try again
                size_t dst_used = dst_len - dst_left;
                dst_left += dst_len;
                dst_len += dst_len;
                dst.resize(dst_len);

                // dst.resize might have allocated destination buffer in another area
                // of memory, thus our previous pointer "dst" will be invalid; re-point
                // it using "dst_used".
                dst_ptr = &dst[dst_used];
            } else {
                throw std::runtime_error("iconv error");
            }
        } else {
            // conversion successful
            dst.resize(dst_len - dst_left);
            break;
        }
    }

    if (iconv_close(cd) != 0)
        throw std::runtime_error("iconv close error");

    return dst;
}